

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

ContentEncoding * __thiscall
mkvparser::Track::GetContentEncodingByIndex(Track *this,unsigned_long idx)

{
  ulong uVar1;
  ptrdiff_t count;
  unsigned_long idx_local;
  Track *this_local;
  
  uVar1 = (long)this->content_encoding_entries_end_ - (long)this->content_encoding_entries_ >> 3;
  if (-1 < (long)uVar1) {
    if (idx < uVar1) {
      this_local = (Track *)this->content_encoding_entries_[idx];
    }
    else {
      this_local = (Track *)0x0;
    }
    return (ContentEncoding *)this_local;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1335,
                "const ContentEncoding *mkvparser::Track::GetContentEncodingByIndex(unsigned long) const"
               );
}

Assistant:

const ContentEncoding* Track::GetContentEncodingByIndex(
    unsigned long idx) const {
  const ptrdiff_t count =
      content_encoding_entries_end_ - content_encoding_entries_;
  assert(count >= 0);

  if (idx >= static_cast<unsigned long>(count))
    return NULL;

  return content_encoding_entries_[idx];
}